

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall spvtools::opt::IRContext::ForgetUses(IRContext *this,Instruction *inst)

{
  bool bVar1;
  Analysis AVar2;
  DefUseManager *this_00;
  DecorationManager *this_01;
  DebugInfoManager *this_02;
  
  AVar2 = this->valid_analyses_;
  if ((AVar2 & kAnalysisBegin) != kAnalysisNone) {
    this_00 = get_def_use_mgr(this);
    analysis::DefUseManager::EraseUseRecordsOfOperandIds(this_00,inst);
    AVar2 = this->valid_analyses_;
  }
  if ((AVar2 & kAnalysisDecorations) != kAnalysisNone) {
    bVar1 = Instruction::IsDecoration(inst);
    if (bVar1) {
      this_01 = get_decoration_mgr(this);
      analysis::DecorationManager::RemoveDecoration(this_01,inst);
    }
  }
  if ((this->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone) {
    this_02 = get_debug_info_mgr(this);
    analysis::DebugInfoManager::ClearDebugInfo(this_02,inst);
  }
  RemoveFromIdToName(this,inst);
  return;
}

Assistant:

void IRContext::ForgetUses(Instruction* inst) {
  if (AreAnalysesValid(kAnalysisDefUse)) {
    get_def_use_mgr()->EraseUseRecordsOfOperandIds(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      get_decoration_mgr()->RemoveDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ClearDebugInfo(inst);
  }
  RemoveFromIdToName(inst);
}